

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O3

MMDB_entry_data_list_s * test_map_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_s entry_data;
  int iVar1;
  char *__s1;
  MMDB_entry_data_list_s *pMVar2;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 uVar3;
  char *pcVar4;
  
  pMVar2 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xc3,(pMVar2->entry_data).type,"==",7,"\'map\' key\'s value is a map",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,199,(pMVar2->entry_data).data_size,"==",1,
                "\'map\' key\'s value has 1 key/value pair",0);
  pMVar2 = pMVar2->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xcd,(pMVar2->entry_data).type,"==",2,"found a map key in \'map\'",0);
  uVar3 = *(undefined8 *)&(pMVar2->entry_data).field_0x8;
  pcVar4 = (pMVar2->entry_data).field_1.utf8_string;
  entry_data.field_1.uint128._8_8_ = unaff_RBX;
  entry_data._0_24_ = *(undefined1 (*) [24])((long)&(pMVar2->entry_data).field_1 + 8);
  entry_data.offset = (int)unaff_R12;
  entry_data.offset_to_next = (int)((ulong)unaff_R12 >> 0x20);
  entry_data.data_size = (int)unaff_R13;
  entry_data.type = (int)((ulong)unaff_R13 >> 0x20);
  __s1 = dup_entry_string_or_bail(entry_data);
  iVar1 = strcmp(__s1,"mapX");
  ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0xcf,(uint)(iVar1 == 0),"key name is mapX",0);
  free(__s1);
  pMVar2 = pMVar2->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xd6,(pMVar2->entry_data).type,"==",7,"\'map{mapX}\' key\'s value is a map",0,uVar3
                ,pcVar4);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0xda,(pMVar2->entry_data).data_size,"==",2,
                "\'map\' key\'s value has 2 key/value pairs",0);
  pMVar2 = test_mapX_key_value_pair(pMVar2);
  pMVar2 = test_mapX_key_value_pair(pMVar2);
  return pMVar2;
}

Assistant:

MMDB_entry_data_list_s *
test_map_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *map = entry_data_list = entry_data_list->next;
    cmp_ok(map->entry_data.type,
           "==",
           MMDB_DATA_TYPE_MAP,
           "'map' key's value is a map");
    cmp_ok(map->entry_data.data_size,
           "==",
           1,
           "'map' key's value has 1 key/value pair");

    MMDB_entry_data_list_s *map_key_1 = entry_data_list = entry_data_list->next;
    cmp_ok(map_key_1->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "found a map key in 'map'");
    char *map_key_1_name = dup_entry_string_or_bail(map_key_1->entry_data);
    ok(strcmp(map_key_1_name, "mapX") == 0, "key name is mapX");
    free(map_key_1_name);

    MMDB_entry_data_list_s *mapX = entry_data_list = entry_data_list->next;
    cmp_ok(mapX->entry_data.type,
           "==",
           MMDB_DATA_TYPE_MAP,
           "'map{mapX}' key's value is a map");
    cmp_ok(mapX->entry_data.data_size,
           "==",
           2,
           "'map' key's value has 2 key/value pairs");

    entry_data_list = test_mapX_key_value_pair(entry_data_list);
    entry_data_list = test_mapX_key_value_pair(entry_data_list);

    return entry_data_list;
}